

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::buffer(Forth *this)

{
  bool bVar1;
  reference ppVar2;
  mapped_type *pmVar3;
  uint local_43c;
  CAddr CStack_438;
  BlockInfo newBlock;
  uint address;
  uint ec;
  char buffer [1024];
  _Self local_20;
  iterator foundIt;
  Cell u;
  Forth *this_local;
  
  requireDStackDepth(this,1,"BUFFER");
  requireDStackAvailable(this,1,"BUFFER");
  foundIt._M_node._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  if (foundIt._M_node._4_4_ != 0) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::find(&this->blocksInProcess,(key_type *)((long)&foundIt._M_node + 4));
    buffer._1016_8_ =
         std::
         map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
         ::end(&this->blocksInProcess);
    bVar1 = std::operator==(&local_20,(_Self *)(buffer + 0x3f8));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      memset(&address,0x20,0x400);
      ForthStack<unsigned_int>::setTop(&this->dStack,0x400);
      memAllocate(this);
      newBlock._8_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
      pop(this);
      newBlock.blockLocation = ForthStack<unsigned_int>::getTop(&this->dStack);
      moveIntoDataSpace(this,newBlock.blockLocation,(char *)&address,0x400);
      memset(&local_43c,0,0xc);
      local_43c = foundIt._M_node._4_4_;
      CStack_438 = newBlock.blockLocation;
      newBlock.blockNumber = newBlock.blockNumber & 0xffffff00;
      pmVar3 = std::
               map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
               ::operator[](&this->blocksInProcess,(key_type *)((long)&foundIt._M_node + 4));
      pmVar3->blockNumber = local_43c;
      pmVar3->blockLocation = CStack_438;
      *(Cell *)&pmVar3->blockModified = newBlock.blockNumber;
    }
    else {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>::
               operator*(&local_20);
      ForthStack<unsigned_int>::setTop(&this->dStack,(ppVar2->second).blockLocation);
    }
    this->blockCurrent = foundIt._M_node._4_4_;
  }
  return;
}

Assistant:

void buffer(){
			REQUIRE_DSTACK_DEPTH(1, "BUFFER");
			REQUIRE_DSTACK_AVAILABLE(1, "BUFFER");
			Cell u = dStack.getTop();
			if (u > 0) {
				auto foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					dStack.setTop((*foundIt).second.blockLocation);
				}
				else {
						char buffer[1024];
						std::memset(buffer, ' ', 1024);
						// get memory
						dStack.setTop(1024);
						memAllocate();
						auto ec = dStack.getTop(); pop();
						// copy to memory
						auto address = dStack.getTop();
						moveIntoDataSpace(address, buffer, 1024);
						// save block info
						struct BlockInfo newBlock {};
						newBlock.blockNumber = u;
						newBlock.blockLocation = address;
						newBlock.blockModified = false;
						blocksInProcess[u] = newBlock;
						// push address - address already on stack top
				}
				blockCurrent = u;
			}

		}